

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void __thiscall
rsg::ProgramExecutor::setTexture
          (ProgramExecutor *this,int samplerNdx,Texture2D *texture,Sampler *sampler)

{
  mapped_type *this_00;
  Sampler2D local_70;
  Sampler *local_28;
  Sampler *sampler_local;
  Texture2D *texture_local;
  ProgramExecutor *pPStack_10;
  int samplerNdx_local;
  ProgramExecutor *this_local;
  
  local_28 = sampler;
  sampler_local = (Sampler *)texture;
  texture_local._4_4_ = samplerNdx;
  pPStack_10 = this;
  Sampler2D::Sampler2D(&local_70,texture,sampler);
  this_00 = std::
            map<int,_rsg::Sampler2D,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::Sampler2D>_>_>
            ::operator[](&this->m_samplers2D,(key_type_conflict *)((long)&texture_local + 4));
  Sampler2D::operator=(this_00,&local_70);
  return;
}

Assistant:

void ProgramExecutor::setTexture (int samplerNdx, const tcu::Texture2D* texture, const tcu::Sampler& sampler)
{
	m_samplers2D[samplerNdx] = Sampler2D(texture, sampler);
}